

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
::raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
               *this,raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
                     *that,allocator_type *a)

{
  undefined1 auVar1 [16];
  CommonFields *pCVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t sVar5;
  GrowthInfo *this_00;
  ulong uVar6;
  ctrl_t cVar7;
  undefined1 (*pauVar8) [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
  *ppVar9;
  ushort x;
  FindInfo FVar10;
  iterator iVar11;
  GroupPortableImpl local_88;
  size_t local_80;
  long local_78;
  CommonFields *local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  undefined1 (*local_50) [16];
  NonIterableBitMask<unsigned_long,_8,_3> local_48;
  ulong local_40;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
  *local_38;
  
  sVar4 = size(that);
  raw_hash_set(this,sVar4 + (long)(sVar4 - 1) / 7,(hasher *)that,(key_equal *)that,a);
  AssertNotDebugCapacity(that);
  local_68 = size(that);
  if (local_68 != 0) {
    sVar4 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    local_60 = (ulong)(this->settings_).
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control >> 0xc | 1;
    local_78 = *(long *)((long)&(that->settings_).
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8);
    uVar6 = (that->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    pauVar8 = (undefined1 (*) [16])
              (that->settings_).
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.control;
    local_80 = sVar4;
    if (uVar6 < 0xf) {
      if (8 < uVar6) {
        __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x78b,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                     );
      }
      local_88.ctrl = *(uint64_t *)(*pauVar8 + uVar6);
      local_48.mask_ = (unsigned_long)GroupPortableImpl::MaskFull(&local_88);
      local_78 = local_78 + -0x60;
      sVar4 = local_80;
      for (; local_48.mask_ != 0; local_48.mask_ = local_48.mask_ - 1 & local_48.mask_) {
        uVar3 = NonIterableBitMask<unsigned_long,_8,_3>::LowestBitSet(&local_48);
        ppVar9 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
                  *)((ulong)uVar3 * 0x60 + local_78);
        if (local_80 < 0x11) {
          sVar4 = sVar4 + local_60 & local_80;
        }
        else {
          local_88.ctrl = (uint64_t)this;
          sVar4 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::HashElement,std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                            ((HashElement *)&local_88,ppVar9);
          FVar10 = find_first_non_full_outofline((CommonFields *)this,sVar4);
          sVar4 = FVar10.offset;
          CommonFields::infoz((CommonFields *)this);
        }
        cVar7 = pauVar8[-1][(ulong)uVar3 + 0xf];
        local_88.ctrl = (uint64_t)this;
        sVar5 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::HashElement,std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                          ((HashElement *)&local_88,ppVar9);
        if (((ctrl_t)sVar5 & ~kEmpty) != cVar7) {
LAB_001ffaef:
          __assert_fail("(H2(PolicyTraits::apply(HashElement{hash_ref()}, PolicyTraits::element(that_slot))) == h2 && \"hash function value changed unexpectedly during the copy\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xb05,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>>::raw_hash_set(const raw_hash_set<FlatHashMapPolicy<basic_string<char>, AnnotationRecord>, StringHash, StringEq, allocator<pair<const basic_string<char>, AnnotationRecord>>> &, const allocator_type &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>]"
                       );
        }
        SetCtrl((CommonFields *)this,sVar4,cVar7,0x60);
        iVar11 = iterator_at(this,sVar4);
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
        ::
        emplace_at<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
                    *)this,iVar11,ppVar9);
      }
    }
    else {
      local_40 = (that->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.size_ >> 1;
      uVar6 = local_40;
      local_70 = (CommonFields *)this;
      local_38 = that;
      while (uVar6 != 0) {
        auVar1 = *pauVar8;
        local_58 = uVar6;
        local_50 = pauVar8;
        for (x = ~((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf); pauVar8 = local_50, x != 0;
            x = x - 1 & x) {
          uVar3 = TrailingZeros<unsigned_short>(x);
          pCVar2 = local_70;
          uVar6 = (ulong)uVar3;
          cVar7 = (*pauVar8)[uVar6];
          if (cVar7 < ~kSentinel) {
            __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x79d,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                         );
          }
          ppVar9 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
                    *)(uVar6 * 0x60 + local_78);
          if (local_80 < 0x11) {
            sVar4 = sVar4 + local_60 & local_80;
          }
          else {
            local_88.ctrl = (uint64_t)local_70;
            sVar4 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::HashElement,std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                              ((HashElement *)&local_88,ppVar9);
            FVar10 = find_first_non_full_outofline(pCVar2,sVar4);
            sVar4 = FVar10.offset;
            CommonFields::infoz(pCVar2);
            cVar7 = (*local_50)[uVar6];
          }
          local_88.ctrl = (uint64_t)local_70;
          sVar5 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::HashElement,std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                            ((HashElement *)&local_88,ppVar9);
          pCVar2 = local_70;
          if (((ctrl_t)sVar5 & ~kEmpty) != cVar7) goto LAB_001ffaef;
          SetCtrl(local_70,sVar4,cVar7,0x60);
          iVar11 = iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
                                *)pCVar2,sVar4);
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
          ::
          emplace_at<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
                      *)pCVar2,iVar11,ppVar9);
          local_58 = local_58 - 1;
        }
        pauVar8 = local_50 + 1;
        local_78 = local_78 + 0x600;
        uVar6 = local_58;
        if ((local_58 != 0) && ((*local_50)[0xf] == -1)) {
          __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7a5,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                       );
        }
      }
      this = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
              *)local_70;
      if (local_40 <
          (local_38->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ >> 1) {
        __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7aa,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                     );
      }
    }
    if (local_80 < 0x11) {
      CommonFields::infoz((CommonFields *)this);
    }
    ((CommonFields *)this)->size_ = (ulong)((uint)((CommonFields *)this)->size_ & 1) + local_68 * 2;
    this_00 = CommonFields::growth_info((CommonFields *)this);
    GrowthInfo::OverwriteManyEmptyAsFull(this_00,local_68);
  }
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
      : raw_hash_set(GrowthToLowerboundCapacity(that.size()), that.hash_ref(),
                     that.eq_ref(), a) {
    that.AssertNotDebugCapacity();
    const size_t size = that.size();
    if (size == 0) {
      return;
    }
    // We don't use `that.is_soo()` here because `that` can have non-SOO
    // capacity but have a size that fits into SOO capacity.
    if (fits_in_soo(size)) {
      ABSL_SWISSTABLE_ASSERT(size == 1);
      common().set_full_soo();
      emplace_at(soo_iterator(), *that.begin());
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) resize_with_soo_infoz(infoz);
      return;
    }
    ABSL_SWISSTABLE_ASSERT(!that.is_soo());
    const size_t cap = capacity();
    // Note about single group tables:
    // 1. It is correct to have any order of elements.
    // 2. Order has to be non deterministic.
    // 3. We are assigning elements with arbitrary `shift` starting from
    //    `capacity + shift` position.
    // 4. `shift` must be coprime with `capacity + 1` in order to be able to use
    //     modular arithmetic to traverse all positions, instead if cycling
    //     through a subset of positions. Odd numbers are coprime with any
    //     `capacity + 1` (2^N).
    size_t offset = cap;
    const size_t shift =
        is_single_group(cap) ? (PerTableSalt(control()) | 1) : 0;
    IterateOverFullSlots(
        that.common(), that.slot_array(),
        [&](const ctrl_t* that_ctrl,
            slot_type* that_slot) ABSL_ATTRIBUTE_ALWAYS_INLINE {
          if (shift == 0) {
            // Big tables case. Position must be searched via probing.
            // The table is guaranteed to be empty, so we can do faster than
            // a full `insert`.
            const size_t hash = PolicyTraits::apply(
                HashElement{hash_ref()}, PolicyTraits::element(that_slot));
            FindInfo target = find_first_non_full_outofline(common(), hash);
            infoz().RecordInsert(hash, target.probe_length);
            offset = target.offset;
          } else {
            // Small tables case. Next position is computed via shift.
            offset = (offset + shift) & cap;
          }
          const h2_t h2 = static_cast<h2_t>(*that_ctrl);
          ABSL_SWISSTABLE_ASSERT(  // We rely that hash is not changed for small
                                   // tables.
              H2(PolicyTraits::apply(HashElement{hash_ref()},
                                     PolicyTraits::element(that_slot))) == h2 &&
              "hash function value changed unexpectedly during the copy");
          SetCtrl(common(), offset, h2, sizeof(slot_type));
          emplace_at(iterator_at(offset), PolicyTraits::element(that_slot));
          common().maybe_increment_generation_on_insert();
        });
    if (shift != 0) {
      // On small table copy we do not record individual inserts.
      // RecordInsert requires hash, but it is unknown for small tables.
      infoz().RecordStorageChanged(size, cap);
    }
    common().set_size(size);
    growth_info().OverwriteManyEmptyAsFull(size);
  }